

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_batchnorm_scale(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  size_type sVar7;
  reference ppLVar8;
  reference pvVar9;
  size_type sVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  reference pvVar13;
  long in_RDI;
  int top_blob_index_final;
  int q;
  float *bias;
  float *slope;
  int channels;
  Scale *scale;
  BatchNorm *batchnorm;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  FILE *in_stack_ffffffffffffff40;
  int local_a4;
  size_type local_78;
  size_type local_68;
  
  sVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_68 = 0;
  do {
    if (sVar7 <= local_68) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_68);
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff40,
                            (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (!bVar6) {
      ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_68);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->tops,0);
      iVar1 = *pvVar9;
      local_78 = local_68;
      do {
        do {
          do {
            local_78 = local_78 + 1;
            if (sVar7 <= local_78) goto LAB_0013864f;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_78);
            bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffff40,
                                    (char *)CONCAT44(in_stack_ffffffffffffff3c,
                                                     in_stack_ffffffffffffff38));
          } while (bVar6);
          ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_78);
          sVar10 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar8)->bottoms);
        } while (sVar10 != 1);
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_78);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->bottoms,0);
      } while (*pvVar9 != iVar1);
LAB_0013864f:
      if (local_78 != sVar7) {
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_68);
        pLVar2 = *ppLVar8;
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_78);
        pLVar3 = *ppLVar8;
        in_stack_ffffffffffffff40 = _stderr;
        uVar11 = std::__cxx11::string::c_str();
        uVar12 = std::__cxx11::string::c_str();
        fprintf(in_stack_ffffffffffffff40,"fuse_batchnorm_scale %s %s\n",uVar11,uVar12);
        iVar1 = *(int *)&pLVar2[1]._vptr_Layer;
        lVar4 = *(long *)&pLVar2[1].one_blob_only;
        lVar5 = *(long *)&pLVar2[2].support_tensor_storage;
        for (local_a4 = 0; local_a4 < iVar1; local_a4 = local_a4 + 1) {
          *(float *)(lVar4 + (long)local_a4 * 4) =
               *(float *)(lVar4 + (long)local_a4 * 4) *
               *(float *)(*(long *)&pLVar3[1].one_blob_only + (long)local_a4 * 4);
          if (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0) {
            *(float *)(lVar5 + (long)local_a4 * 4) =
                 *(float *)(lVar5 + (long)local_a4 * 4) *
                 *(float *)(*(long *)&pLVar3[1].one_blob_only + (long)local_a4 * 4);
          }
          else {
            *(float *)(lVar5 + (long)local_a4 * 4) =
                 *(float *)(lVar5 + (long)local_a4 * 4) *
                 *(float *)(*(long *)&pLVar3[1].one_blob_only + (long)local_a4 * 4) +
                 *(float *)(*(long *)&pLVar3[1].name + (long)local_a4 * 4);
          }
        }
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
        iVar1 = *pvVar9;
        in_stack_ffffffffffffff38 = iVar1;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
        *pvVar9 = in_stack_ffffffffffffff38;
        in_stack_ffffffffffffff3c = (int)local_68;
        pvVar13 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                             (long)iVar1);
        pvVar13->producer = in_stack_ffffffffffffff3c;
        std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
      }
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_batchnorm_scale()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "BatchNorm")
            continue;

        // BatchNorm - Scale
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Scale")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse BatchNorm - Scale to BatchNorm
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[i];
        ncnn::Scale* scale = (ncnn::Scale*)layers[j];

        fprintf(stderr, "fuse_batchnorm_scale %s %s\n", batchnorm->name.c_str(), scale->name.c_str());

        {
            //             v = ((v - mean) / sqrt(var + eps) * slope + bias) * s + b
            //               =  (v - mean) / sqrt(var + eps) * (slope * s) + (bias * s + b)

            int channels = batchnorm->channels;

            float* slope = batchnorm->slope_data;
            float* bias = batchnorm->bias_data;

            for (int q = 0; q < channels; q++)
            {
                slope[q] = slope[q] * scale->scale_data[q];
                if (scale->bias_term)
                    bias[q] = bias[q] * scale->scale_data[q] + scale->bias_data[q];
                else
                    bias[q] = bias[q] * scale->scale_data[q];
            }
        }

        int top_blob_index_final = scale->tops[0];
        batchnorm->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        scale->type = "ncnnfused";
    }

    return 0;
}